

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbkeyboard.cpp
# Opt level: O1

xcb_keysym_t getUnshiftedXKey(xcb_keysym_t unshifted,xcb_keysym_t shifted)

{
  xcb_keysym_t xVar1;
  long in_FS_OFFSET;
  xcb_keysym_t xupper;
  xcb_keysym_t xlower;
  uint local_28;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  xVar1 = 0;
  if (shifted == 0) {
    local_24 = 0xaaaaaaaa;
    local_28 = 0xaaaaaaaa;
    QXkbCommon::xkbcommon_XConvertCase(unshifted,&local_24,&local_28);
    xVar1 = 0;
    if (local_28 == unshifted) {
      xVar1 = local_24;
    }
    if (local_24 == local_28) {
      xVar1 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return xVar1;
  }
  __stack_chk_fail();
}

Assistant:

static xcb_keysym_t getUnshiftedXKey(xcb_keysym_t unshifted, xcb_keysym_t shifted)
{
    if (shifted != XKB_KEY_NoSymbol) // Has a shifted symbol
        return 0;

    xcb_keysym_t xlower;
    xcb_keysym_t xupper;
    QXkbCommon::xkbcommon_XConvertCase(unshifted, &xlower, &xupper);

    if (xlower != xupper          // Check if symbol is cased
        && unshifted == xupper) { // Unshifted must be upper case
        return xlower;
    }

    return 0;
}